

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O1

bool tchecker::dbm::is_consistent(db_t *dbm,clock_id_t dim)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x53,
                  "bool tchecker::dbm::is_consistent(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x54,
                  "bool tchecker::dbm::is_consistent(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  if (*dbm == (db_t)0x1) {
    uVar1 = 1;
    uVar2 = dim + 1;
    do {
      uVar3 = uVar1;
      if (dim == uVar3) break;
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + dim + 1;
      uVar1 = uVar3 + 1;
    } while (dbm[uVar4] == (db_t)0x1);
    bVar5 = dim <= uVar3;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool is_consistent(tchecker::dbm::db_t const * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    if (DBM(i, i) != tchecker::dbm::LE_ZERO)
      return false;
  return true;
}